

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::DescriptorScalarReplacement::ReplaceCandidate
          (DescriptorScalarReplacement *this,Instruction *var)

{
  IRContext *this_00;
  DefUseManager *this_01;
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  uint32_t id;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  entry_point_work_list;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> load_work_list
  ;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  access_chain_work_list;
  undefined8 *local_b8;
  undefined8 *puStack_b0;
  long local_a8;
  undefined8 *local_98;
  undefined8 *puStack_90;
  long local_88;
  undefined8 *local_78;
  undefined8 *puStack_70;
  long local_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_78 = (undefined8 *)0x0;
  puStack_70 = (undefined8 *)0x0;
  id = 0;
  local_68 = 0;
  local_88 = 0;
  local_98 = (undefined8 *)0x0;
  puStack_90 = (undefined8 *)0x0;
  local_a8 = 0;
  local_b8 = (undefined8 *)0x0;
  puStack_b0 = (undefined8 *)0x0;
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  if (var->has_result_id_ == true) {
    id = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x20);
  *(DescriptorScalarReplacement **)local_58._M_unused._0_8_ = this;
  *(undefined8 ***)((long)local_58._M_unused._0_8_ + 8) = &local_78;
  *(undefined8 ***)((long)local_58._M_unused._0_8_ + 0x10) = &local_98;
  *(undefined8 ***)((long)local_58._M_unused._0_8_ + 0x18) = &local_b8;
  pcStack_40 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/desc_sroa.cpp:62:25)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/desc_sroa.cpp:62:25)>
             ::_M_manager;
  bVar2 = analysis::DefUseManager::WhileEachUser
                    (this_01,id,(function<bool_(spvtools::opt::Instruction_*)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  puVar6 = puStack_70;
  puVar4 = local_78;
  if (bVar2) {
    for (; puVar1 = puStack_90, puVar5 = local_98, puVar4 != puVar6; puVar4 = puVar4 + 1) {
      bVar2 = ReplaceAccessChain(this,var,(Instruction *)*puVar4);
      if (!bVar2) goto LAB_001fba34;
    }
    for (; puVar4 = puStack_b0, puVar6 = local_b8, puVar5 != puVar1; puVar5 = puVar5 + 1) {
      bVar2 = ReplaceLoadedValue(this,var,(Instruction *)*puVar5);
      if (!bVar2) goto LAB_001fba34;
    }
    bVar2 = local_b8 == puStack_b0;
    if ((!bVar2) && (bVar3 = ReplaceEntryPoint(this,var,(Instruction *)*local_b8), bVar3)) {
      do {
        puVar6 = puVar6 + 1;
        bVar2 = puVar6 == puVar4;
        if (bVar2) break;
        bVar3 = ReplaceEntryPoint(this,var,(Instruction *)*puVar6);
      } while (bVar3);
    }
  }
  else {
LAB_001fba34:
    bVar2 = false;
  }
  if (local_b8 != (undefined8 *)0x0) {
    operator_delete(local_b8,local_a8 - (long)local_b8);
  }
  if (local_98 != (undefined8 *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  if (local_78 != (undefined8 *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  return bVar2;
}

Assistant:

bool DescriptorScalarReplacement::ReplaceCandidate(Instruction* var) {
  std::vector<Instruction*> access_chain_work_list;
  std::vector<Instruction*> load_work_list;
  std::vector<Instruction*> entry_point_work_list;
  bool failed = !get_def_use_mgr()->WhileEachUser(
      var->result_id(), [this, &access_chain_work_list, &load_work_list,
                         &entry_point_work_list](Instruction* use) {
        if (use->opcode() == spv::Op::OpName) {
          return true;
        }

        if (use->IsDecoration()) {
          return true;
        }

        switch (use->opcode()) {
          case spv::Op::OpAccessChain:
          case spv::Op::OpInBoundsAccessChain:
            access_chain_work_list.push_back(use);
            return true;
          case spv::Op::OpLoad:
            load_work_list.push_back(use);
            return true;
          case spv::Op::OpEntryPoint:
            entry_point_work_list.push_back(use);
            return true;
          default:
            context()->EmitErrorMessage(
                "Variable cannot be replaced: invalid instruction", use);
            return false;
        }
        return true;
      });

  if (failed) {
    return false;
  }

  for (Instruction* use : access_chain_work_list) {
    if (!ReplaceAccessChain(var, use)) {
      return false;
    }
  }
  for (Instruction* use : load_work_list) {
    if (!ReplaceLoadedValue(var, use)) {
      return false;
    }
  }
  for (Instruction* use : entry_point_work_list) {
    if (!ReplaceEntryPoint(var, use)) {
      return false;
    }
  }
  return true;
}